

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O1

void FastPForLib::Simple9<true,_false>::unpack3_9(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0x19 & 7;
  puVar1[1] = *puVar2 >> 0x16 & 7;
  puVar1[2] = *puVar2 >> 0x13 & 7;
  puVar1[3] = *(ushort *)((long)puVar2 + 2) & 7;
  puVar1[4] = *puVar2 >> 0xd & 7;
  puVar1[5] = *puVar2 >> 10 & 7;
  puVar1[6] = *puVar2 >> 7 & 7;
  puVar1[7] = *puVar2 >> 4 & 7;
  puVar1[8] = *puVar2 >> 1 & 7;
  *in = puVar2 + 1;
  *out = puVar1 + 9;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack3_9(uint32_t **out,
                                            const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 25) & 0x07;
  pout[1] = (pin[0] >> 22) & 0x07;
  pout[2] = (pin[0] >> 19) & 0x07;
  pout[3] = (pin[0] >> 16) & 0x07;
  pout[4] = (pin[0] >> 13) & 0x07;
  pout[5] = (pin[0] >> 10) & 0x07;
  pout[6] = (pin[0] >> 7) & 0x07;
  pout[7] = (pin[0] >> 4) & 0x07;
  pout[8] = (pin[0] >> 1) & 0x07;

  *in = pin + 1;
  *out = pout + 9;
}